

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O2

vw * VW::initialize(options_i *options,io_buf *model,bool skipModelLoad,
                   trace_message_t trace_listener,void *trace_context)

{
  element_type eVar1;
  element_type *peVar2;
  int iVar3;
  vw *all;
  typed_option<bool> *ptVar4;
  allocator local_119;
  string local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  all_initial_regressor_files;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0;
  io_buf localModel;
  
  all = parse_args(options,trace_listener,trace_context);
  io_buf::io_buf(&localModel);
  if (model == (io_buf *)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&all_initial_regressor_files,&all->initial_regressors);
    std::__cxx11::string::string((string *)&local_118,"input_feature_regularizer",&local_119);
    iVar3 = (*options->_vptr_options_i[1])(options,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    if ((char)iVar3 != '\0') {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&all_initial_regressor_files,&all->per_feature_regularizer_input);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_e0,&all_initial_regressor_files);
    model = &localModel;
    read_regressor_file(all,&local_e0,model);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_e0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&all_initial_regressor_files);
  }
  load_header_merge_options(options,all,model);
  parse_modules(options,all);
  parse_sources(options,all,model,skipModelLoad);
  (*options->_vptr_options_i[7])(options);
  std::__cxx11::string::string
            ((string *)&local_118,"help",(allocator *)&all_initial_regressor_files);
  ptVar4 = config::options_i::get_typed_option<bool>(options,&local_118);
  peVar2 = (ptVar4->m_value).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2 == (element_type *)0x0) {
    std::__cxx11::string::~string((string *)&local_118);
  }
  else {
    eVar1 = *peVar2;
    std::__cxx11::string::~string((string *)&local_118);
    if (eVar1 == true) {
      (*options->_vptr_options_i[2])(&local_118,options);
      std::operator<<((ostream *)&std::cout,(string *)&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      exit(0);
    }
  }
  (**(code **)(all->l + 0x10))(*(undefined8 *)all->l);
  io_buf::~io_buf(&localModel);
  return all;
}

Assistant:

vw* initialize(
    options_i& options, io_buf* model, bool skipModelLoad, trace_message_t trace_listener, void* trace_context)
{
  vw& all = parse_args(options, trace_listener, trace_context);

  try
  {
    // if user doesn't pass in a model, read from options
    io_buf localModel;
    if (!model)
    {
      std::vector<std::string> all_initial_regressor_files(all.initial_regressors);
      if (options.was_supplied("input_feature_regularizer"))
      {
        all_initial_regressor_files.push_back(all.per_feature_regularizer_input);
      }
      read_regressor_file(all, all_initial_regressor_files, localModel);
      model = &localModel;
    }

    // Loads header of model files and loads the command line options into the options object.
    load_header_merge_options(options, all, *model);

    parse_modules(options, all);

    parse_sources(options, all, *model, skipModelLoad);

    options.check_unregistered();

    // upon direct query for help -- spit it out to stdout;
    if (options.get_typed_option<bool>("help").value())
    {
      cout << options.help();
      exit(0);
    }

    all.l->init_driver();

    return &all;
  }
  catch (std::exception& e)
  {
    all.trace_message << "Error: " << e.what() << endl;
    finish(all);
    throw;
  }
  catch (...)
  {
    finish(all);
    throw;
  }
}